

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rootindexproxymodel.cpp
# Opt level: O1

QAbstractItemModel * createTreeModel(QObject *parent)

{
  int iVar1;
  QStandardItemModel *this;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  QModelIndex grandParIdx;
  QModelIndex parIdx;
  ulong local_118;
  QArrayData *local_110;
  char16_t *local_108;
  undefined8 local_100;
  QString local_f8;
  QArrayData *local_e0;
  char16_t *local_d8;
  undefined8 local_d0;
  anon_union_24_3_e3d07ef4_for_data local_c8;
  QString local_a8;
  QArrayData *local_90;
  char16_t *local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  QArrayData *local_60 [3];
  undefined1 local_48 [24];
  
  this = (QStandardItemModel *)operator_new(0x10);
  QStandardItemModel::QStandardItemModel(this,parent);
  local_c8._forAlignment = -NAN;
  local_c8._8_8_ = 0;
  local_c8._16_8_ = 0;
  (**(code **)(*(long *)this + 0x100))(this,0,3,&local_c8);
  local_c8._forAlignment = -NAN;
  local_c8._8_8_ = 0;
  local_c8._16_8_ = 0;
  (**(code **)(*(long *)this + 0xf8))(this,0,3,&local_c8);
  local_c8._forAlignment = -NAN;
  local_c8._8_8_ = 0;
  local_c8._16_8_ = 0;
  iVar1 = (**(code **)(*(long *)this + 0x78))(this,&local_c8);
  if (0 < iVar1) {
    local_118 = 0;
    do {
      local_c8._forAlignment = -NAN;
      local_c8._8_8_ = 0;
      local_c8._16_8_ = 0;
      iVar1 = (**(code **)(*(long *)this + 0x80))(this,&local_c8);
      iVar2 = (int)local_118;
      if (0 < iVar1) {
        uVar3 = 0;
        do {
          local_78 = 0xffffffffffffffff;
          local_70 = 0;
          uStack_68 = 0;
          (**(code **)(*(long *)this + 0x60))
                    (local_48,this,local_118 & 0xffffffff,uVar3 & 0xffffffff,&local_78);
          local_110 = (QArrayData *)0x0;
          local_108 = L"%1,%2";
          local_100 = 5;
          QString::arg((longlong)&local_f8,(int)&local_110,iVar2,(QChar)0x0);
          QString::arg((longlong)&local_a8,(int)&local_f8,(int)uVar3,(QChar)0x0);
          QVariant::QVariant((QVariant *)&local_c8,&local_a8);
          (**(code **)(*(long *)this + 0x98))(this,local_48,&local_c8,2);
          QVariant::~QVariant((QVariant *)&local_c8);
          if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,8);
            }
          }
          if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,8);
            }
          }
          if (local_110 != (QArrayData *)0x0) {
            LOCK();
            (local_110->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_110->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_110->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_110,2,8);
            }
          }
          uVar3 = uVar3 + 1;
          local_c8._forAlignment = -NAN;
          local_c8._8_8_ = 0;
          local_c8._16_8_ = 0;
          iVar1 = (**(code **)(*(long *)this + 0x80))(this,&local_c8);
        } while ((long)uVar3 < (long)iVar1);
      }
      local_c8._forAlignment = -NAN;
      local_c8._8_8_ = 0;
      local_c8._16_8_ = 0;
      (**(code **)(*(long *)this + 0x60))(local_48,this,local_118,0,&local_c8);
      (**(code **)(*(long *)this + 0x100))(this,0,2,local_48);
      (**(code **)(*(long *)this + 0xf8))(this,0,4);
      iVar1 = (**(code **)(*(long *)this + 0x78))(this,local_48);
      if (0 < iVar1) {
        uVar3 = 0;
        do {
          iVar1 = (**(code **)(*(long *)this + 0x80))(this,local_48);
          if (0 < iVar1) {
            uVar4 = 0;
            do {
              (**(code **)(*(long *)this + 0x60))
                        (&local_78,this,uVar3 & 0xffffffff,uVar4 & 0xffffffff,local_48);
              local_e0 = (QArrayData *)0x0;
              local_d8 = L"%1,%2,%3";
              local_d0 = 8;
              QString::arg((longlong)&local_110,(int)&local_e0,iVar2,(QChar)0x0);
              QString::arg((longlong)&local_f8,(int)&local_110,(int)uVar3,(QChar)0x0);
              QString::arg((longlong)&local_a8,(int)&local_f8,(int)uVar4,(QChar)0x0);
              QVariant::QVariant((QVariant *)&local_c8,&local_a8);
              (**(code **)(*(long *)this + 0x98))(this,&local_78,&local_c8,2);
              QVariant::~QVariant((QVariant *)&local_c8);
              if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,8);
                }
              }
              if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,8);
                }
              }
              if (local_110 != (QArrayData *)0x0) {
                LOCK();
                (local_110->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_110->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_110->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_110,2,8);
                }
              }
              if (local_e0 != (QArrayData *)0x0) {
                LOCK();
                (local_e0->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_e0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_e0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_e0,2,8);
                }
              }
              uVar4 = uVar4 + 1;
              iVar1 = (**(code **)(*(long *)this + 0x80))(this,local_48);
            } while ((long)uVar4 < (long)iVar1);
          }
          (**(code **)(*(long *)this + 0x60))(&local_78,this,local_118,0,local_48);
          (**(code **)(*(long *)this + 0x100))(this,0,2,&local_78);
          (**(code **)(*(long *)this + 0xf8))(this,0,6);
          iVar1 = (**(code **)(*(long *)this + 0x78))(this,&local_78);
          if (0 < iVar1) {
            uVar4 = 0;
            do {
              iVar1 = (**(code **)(*(long *)this + 0x80))(this,&local_78);
              if (0 < iVar1) {
                uVar5 = 0;
                do {
                  (**(code **)(*(long *)this + 0x60))
                            (&local_a8,this,uVar4 & 0xffffffff,uVar5 & 0xffffffff,&local_78);
                  local_90 = (QArrayData *)0x0;
                  local_88 = L"%1,%2,%3,%4";
                  local_80 = 0xb;
                  QString::arg((longlong)local_60,(int)&local_90,iVar2,(QChar)0x0);
                  QString::arg((longlong)&local_e0,(int)local_60,(int)uVar3,(QChar)0x0);
                  QString::arg((longlong)&local_110,(int)&local_e0,(int)uVar4,(QChar)0x0);
                  QString::arg((longlong)&local_f8,(int)&local_110,(int)uVar5,(QChar)0x0);
                  QVariant::QVariant((QVariant *)&local_c8,&local_f8);
                  (**(code **)(*(long *)this + 0x98))(this,&local_a8,&local_c8);
                  QVariant::~QVariant((QVariant *)&local_c8);
                  if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                         ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,8);
                    }
                  }
                  if (local_110 != (QArrayData *)0x0) {
                    LOCK();
                    (local_110->ref_)._q_value.super___atomic_base<int>._M_i =
                         (local_110->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if ((local_110->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(local_110,2,8);
                    }
                  }
                  if (local_e0 != (QArrayData *)0x0) {
                    LOCK();
                    (local_e0->ref_)._q_value.super___atomic_base<int>._M_i =
                         (local_e0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if ((local_e0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(local_e0,2,8);
                    }
                  }
                  if (local_60[0] != (QArrayData *)0x0) {
                    LOCK();
                    (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                         (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(local_60[0],2,8);
                    }
                  }
                  if (local_90 != (QArrayData *)0x0) {
                    LOCK();
                    (local_90->ref_)._q_value.super___atomic_base<int>._M_i =
                         (local_90->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if ((local_90->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(local_90,2,8);
                    }
                  }
                  uVar5 = uVar5 + 1;
                  iVar1 = (**(code **)(*(long *)this + 0x80))(this,&local_78);
                } while ((long)uVar5 < (long)iVar1);
              }
              uVar4 = uVar4 + 1;
              iVar1 = (**(code **)(*(long *)this + 0x78))(this,&local_78);
            } while ((long)uVar4 < (long)iVar1);
          }
          uVar3 = uVar3 + 1;
          iVar1 = (**(code **)(*(long *)this + 0x78))(this,local_48);
        } while ((long)uVar3 < (long)iVar1);
      }
      local_118 = local_118 + 1;
      local_c8._forAlignment = -NAN;
      local_c8._8_8_ = 0;
      local_c8._16_8_ = 0;
      iVar1 = (**(code **)(*(long *)this + 0x78))(this,&local_c8);
    } while ((long)local_118 < (long)iVar1);
  }
  return (QAbstractItemModel *)this;
}

Assistant:

QAbstractItemModel *createTreeModel(QObject *parent)
{
    QAbstractItemModel *result = nullptr;
#ifdef COMPLEX_MODEL_SUPPORT
    result = new ComplexModel(parent);
    result->insertColumns(0, 3);
    result->insertRows(0, 3);
    for (int i = 0; i < result->rowCount(); ++i) {
        for (int j = 0; j < result->columnCount(); ++j)
            result->setData(result->index(i, j), QStringLiteral("%1,%2").arg(i).arg(j));
        const QModelIndex parIdx = result->index(i, 0);
        result->insertColumns(0, 2, parIdx);
        result->insertRows(0, 4, parIdx);
        for (int k = 0; k < result->rowCount(parIdx); ++k) {
            for (int h = 0; h < result->columnCount(parIdx); ++h)
                result->setData(result->index(k, h, parIdx), QStringLiteral("%1,%2,%3").arg(i).arg(k).arg(h));
            const QModelIndex grandParIdx = result->index(i, 0, parIdx);
            result->insertColumns(0, 2, grandParIdx);
            result->insertRows(0, 6, grandParIdx);
            for (int j = 0; j < result->rowCount(grandParIdx); ++j) {
                for (int h = 0; h < result->columnCount(grandParIdx); ++h)
                    result->setData(result->index(j, h, grandParIdx), QStringLiteral("%1,%2,%3,%4").arg(i).arg(k).arg(j).arg(h));
            }
        }
    }
#endif
    return result;
}